

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O2

ITexture * __thiscall
irr::video::CNullDriver::addTexture(CNullDriver *this,path *name,IImage *image)

{
  int iVar1;
  undefined4 extraout_var;
  double in_XMM0_Qa;
  ITexture *texture;
  
  if ((int)(name->str)._M_string_length == 0) {
    os::Printer::log((Printer *)"Could not create ITexture, texture needs to have a non-empty name."
                     ,in_XMM0_Qa);
  }
  else if (image != (IImage *)0x0) {
    iVar1 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x75])();
    texture = (ITexture *)CONCAT44(extraout_var,iVar1);
    if (texture != (ITexture *)0x0) {
      addTexture(this,texture);
      IReferenceCounted::drop
                ((IReferenceCounted *)
                 ((long)&texture->_vptr_ITexture + (long)texture->_vptr_ITexture[-3]));
      return texture;
    }
  }
  return (ITexture *)0x0;
}

Assistant:

ITexture *CNullDriver::addTexture(const io::path &name, IImage *image)
{
	if (0 == name.size()) {
		os::Printer::log("Could not create ITexture, texture needs to have a non-empty name.", ELL_WARNING);
		return 0;
	}

	if (!image)
		return 0;

	ITexture *t = 0;

	if (checkImage(image)) {
		t = createDeviceDependentTexture(name, image);
	}

	if (t) {
		addTexture(t);
		t->drop();
	}

	return t;
}